

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O1

double PopulationCost(uint32_t *population,int length,uint32_t *trivial_sym,uint8_t *is_used)

{
  uint32_t uVar1;
  double dVar2;
  VP8LBitEntropy bit_entropy;
  VP8LStreaks stats;
  VP8LBitEntropy local_40;
  VP8LStreaks local_28;
  
  (*VP8LGetEntropyUnrefined)(population,length,&local_40,&local_28);
  if (trivial_sym != (uint32_t *)0x0) {
    uVar1 = 0xffffffff;
    if (local_40.nonzeros == 1) {
      uVar1 = local_40.nonzero_code;
    }
    *trivial_sym = uVar1;
  }
  *is_used = local_28.streaks[1][0] != 0 || local_28.streaks[1][1] != 0;
  if (local_40.nonzeros < 5) {
    dVar2 = 0.0;
    if (local_40.nonzeros < 2) goto LAB_001463b9;
    if (local_40.nonzeros == 3) {
      dVar2 = 0.95;
    }
    else {
      if (local_40.nonzeros == 2) {
        dVar2 = (double)local_40.sum * 0.99 + local_40.entropy * 0.01;
        goto LAB_001463b9;
      }
      dVar2 = 0.7;
    }
  }
  else {
    dVar2 = 0.627;
  }
  dVar2 = (double)(local_40.sum * 2 - local_40.max_val) * dVar2 + (1.0 - dVar2) * local_40.entropy;
  if (dVar2 <= local_40.entropy) {
    dVar2 = local_40.entropy;
  }
LAB_001463b9:
  return (double)local_28.streaks[1][0] * 3.28125 +
         (double)local_28.streaks[0][0] * 1.796875 +
         (double)local_28.counts[1] * 2.578125 + (double)local_28.streaks[1][1] * 0.703125 +
         (double)local_28.counts[0] * 1.5625 + (double)local_28.streaks[0][1] * 0.234375 + 47.9 +
         dVar2;
}

Assistant:

static double PopulationCost(const uint32_t* const population, int length,
                             uint32_t* const trivial_sym,
                             uint8_t* const is_used) {
  VP8LBitEntropy bit_entropy;
  VP8LStreaks stats;
  VP8LGetEntropyUnrefined(population, length, &bit_entropy, &stats);
  if (trivial_sym != NULL) {
    *trivial_sym = (bit_entropy.nonzeros == 1) ? bit_entropy.nonzero_code
                                               : VP8L_NON_TRIVIAL_SYM;
  }
  // The histogram is used if there is at least one non-zero streak.
  *is_used = (stats.streaks[1][0] != 0 || stats.streaks[1][1] != 0);

  return BitsEntropyRefine(&bit_entropy) + FinalHuffmanCost(&stats);
}